

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O2

string * embree::getExecutableFileName_abi_cxx11_(void)

{
  __pid_t _Var1;
  ssize_t sVar2;
  string *in_RDI;
  string pid;
  char buf [4096];
  string sStack_1058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1018 [128];
  
  _Var1 = getpid();
  std::__cxx11::to_string(&sStack_1058,(long)_Var1);
  std::operator+(local_1018,"/proc/",&sStack_1058);
  std::operator+(&local_1038,local_1018,"/exe");
  std::__cxx11::string::~string((string *)local_1018);
  std::__cxx11::string::~string((string *)&sStack_1058);
  memset(local_1018,0,0x1000);
  sVar2 = readlink(local_1038._M_dataplus._M_p,(char *)local_1018,0xfff);
  if (sVar2 == -1) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)in_RDI,(char *)local_1018,(allocator *)&sStack_1058);
  }
  std::__cxx11::string::~string((string *)&local_1038);
  return in_RDI;
}

Assistant:

std::string getExecutableFileName() 
  {
    std::string pid = "/proc/" + toString(getpid()) + "/exe";
    char buf[4096];
    memset(buf,0,sizeof(buf));
    if (readlink(pid.c_str(), buf, sizeof(buf)-1) == -1)
      return std::string();
    return std::string(buf);
  }